

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMapIterator.cpp
# Opt level: O1

Var Js::JavascriptMapIterator::EntryNext(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *this;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var aValue;
  JavascriptMapIterator *pJVar6;
  CallInfo value;
  DynamicObject *pDVar7;
  WriteBarrierPtr<void> WVar8;
  int in_stack_00000010;
  undefined1 local_58 [8];
  ArgumentReader args;
  KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> entry;
  CallInfo callInfo_local;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  entry.value.ptr = (void *)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != (int)entry.value.ptr) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMapIterator.cpp"
                                ,0x16,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00ce8363;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_58 = (undefined1  [8])entry.value.ptr;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_58,(CallInfo *)&entry.value);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar2->super_ScriptContextBase).javascriptLibrary;
  if (((ulong)entry.value.ptr & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMapIterator.cpp"
                                ,0x1a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00ce8363;
    *puVar5 = 0;
  }
  aValue = Arguments::operator[]((Arguments *)local_58,0);
  bVar4 = VarIs<Js::JavascriptMapIterator>(aValue);
  if (!bVar4) {
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ebf3,L"Map Iterator.prototype.next");
  }
  pJVar6 = VarTo<Js::JavascriptMapIterator>(aValue);
  if (((pJVar6->m_map).ptr == (JavascriptMap *)0x0) ||
     (bVar4 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
              ::Iterator::Next(&pJVar6->m_mapIterator), !bVar4)) {
    (pJVar6->m_map).ptr = (JavascriptMap *)0x0;
    pDVar7 = JavascriptLibrary::CreateIteratorResultObjectDone(this);
    return pDVar7;
  }
  JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::KeyValuePair
            ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
             &args.super_Arguments.Values,&((pJVar6->m_mapIterator).current.ptr)->data);
  TVar1 = pJVar6->m_kind;
  WVar8.ptr = args.super_Arguments.Values;
  if ((TVar1 != Key) && (WVar8 = entry.key, TVar1 != Value)) {
    if (TVar1 == KeyAndValue) {
      value = (CallInfo)JavascriptLibrary::CreateArray(this,2);
      Memory::Recycler::WBSetBit((char *)&callInfo_local);
      callInfo_local = (CallInfo)args.super_Arguments.Values;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&callInfo_local);
      (**(code **)(*(long *)value + 0x148))(value,0,callInfo_local,0);
      Memory::Recycler::WBSetBit((char *)&callInfo_local);
      callInfo_local = (CallInfo)entry.key.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&callInfo_local);
      (**(code **)(*(long *)value + 0x148))(value,1,callInfo_local,0);
      goto LAB_00ce8349;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMapIterator.cpp"
                                ,0x3d,"(iterator->m_kind == JavascriptMapIteratorKind::Value)",
                                "iterator->m_kind == JavascriptMapIteratorKind::Value");
    if (!bVar4) {
LAB_00ce8363:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    WVar8 = entry.key;
  }
  Memory::Recycler::WBSetBit((char *)&callInfo_local);
  callInfo_local = (CallInfo)WVar8.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&callInfo_local);
  value = callInfo_local;
LAB_00ce8349:
  pDVar7 = JavascriptLibrary::CreateIteratorResultObject(this,(Var)value,false);
  return pDVar7;
}

Assistant:

Var JavascriptMapIterator::EntryNext(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        Var thisObj = args[0];

        if (!VarIs<JavascriptMapIterator>(thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedMapIterator, _u("Map Iterator.prototype.next"));
        }

        JavascriptMapIterator* iterator = VarTo<JavascriptMapIterator>(thisObj);
        JavascriptMap* map = iterator->m_map;
        auto& mapIterator = iterator->m_mapIterator;

        if (map == nullptr || !mapIterator.Next())
        {
            iterator->m_map = nullptr;
            return library->CreateIteratorResultObjectDone();
        }

        auto entry = mapIterator.Current();
        Var result;

        if (iterator->m_kind == JavascriptMapIteratorKind::KeyAndValue)
        {
            JavascriptArray* keyValueTuple = library->CreateArray(2);
            keyValueTuple->SetItem(0, entry.Key(), PropertyOperation_None);
            keyValueTuple->SetItem(1, entry.Value(), PropertyOperation_None);
            result = keyValueTuple;
        }
        else if (iterator->m_kind == JavascriptMapIteratorKind::Key)
        {
            result = entry.Key();
        }
        else
        {
            Assert(iterator->m_kind == JavascriptMapIteratorKind::Value);
            result = entry.Value();
        }

        return library->CreateIteratorResultObject(result);
    }